

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack1to4.h
# Opt level: O0

void ncnn::convolution_im2col_sgemm_transform_kernel_pack1to4_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  int in_R8D;
  int in_R9D;
  int k;
  float *k30;
  float *k20;
  float *k10;
  float *k00;
  int p;
  float *g00;
  Mat k3;
  Mat k2;
  Mat k1;
  Mat k0;
  int q;
  Mat kernel;
  int maxk;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_fffffffffffff8d0;
  size_t in_stack_fffffffffffff8d8;
  undefined8 in_stack_fffffffffffff8e0;
  int iVar1;
  undefined8 in_stack_fffffffffffff8e8;
  Mat *in_stack_fffffffffffff8f0;
  int local_664;
  Allocator *in_stack_fffffffffffff9b0;
  undefined8 in_stack_fffffffffffff9b8;
  int in_stack_fffffffffffff9c0;
  int in_stack_fffffffffffff9c4;
  int iVar2;
  Mat *in_stack_fffffffffffff9c8;
  undefined4 *local_5f0;
  undefined8 local_5e8;
  undefined8 local_5e0;
  undefined4 local_5c0;
  undefined4 local_5b4;
  undefined8 local_5a8;
  undefined8 local_5a0;
  undefined8 local_598;
  undefined4 local_578;
  undefined4 local_56c;
  undefined8 local_560;
  undefined8 local_558;
  undefined8 local_550;
  undefined4 local_530;
  undefined4 local_524;
  undefined8 local_518;
  undefined8 local_510;
  undefined8 local_508;
  undefined8 local_500;
  undefined4 local_4f8;
  undefined4 local_4e8;
  undefined4 local_4e4;
  undefined4 local_4e0;
  undefined4 local_4dc;
  undefined4 local_4d8;
  undefined8 local_4d0;
  int local_4c8;
  void *local_4b8;
  int *local_4b0;
  long local_4a8;
  long *local_498;
  int local_48c;
  int local_488;
  long local_478;
  int local_46c;
  int local_460;
  int local_45c;
  long *local_458;
  undefined1 *local_448;
  undefined8 *local_438;
  undefined8 *local_428;
  undefined8 *local_418;
  undefined8 *local_408;
  void **local_3f8;
  int local_3d8;
  undefined4 local_3d4;
  void **local_3d0;
  undefined8 *local_3b0;
  undefined8 *local_390;
  undefined8 *local_370;
  undefined8 *local_350;
  undefined1 *local_330;
  undefined1 local_325;
  int local_324;
  undefined1 *local_318;
  undefined1 local_2f5;
  int local_2f4;
  void **local_2f0;
  undefined8 *local_2e8;
  undefined1 local_2c5;
  int local_2c4;
  void **local_2c0;
  undefined8 *local_2b8;
  undefined1 local_295;
  int local_294;
  void **local_290;
  undefined8 *local_288;
  undefined1 local_265;
  int local_264;
  void **local_260;
  undefined8 *local_258;
  undefined1 *local_238;
  int local_22c;
  undefined8 *local_228;
  int local_21c;
  undefined8 *local_218;
  int local_20c;
  undefined8 *local_208;
  int local_1fc;
  undefined8 *local_1f8;
  void *local_150;
  undefined8 *local_138;
  void *local_118;
  undefined8 *local_100;
  void *local_e0;
  undefined8 *local_c8;
  void *local_a8;
  undefined8 *local_90;
  long local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 *local_70;
  undefined4 local_64;
  int local_60;
  int local_5c;
  undefined1 *local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  iVar1 = (int)((ulong)in_stack_fffffffffffff8e0 >> 0x20);
  local_46c = in_R8D * in_R9D;
  local_460 = in_ECX;
  local_45c = in_EDX;
  local_458 = in_RSI;
  Mat::reshape(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0,
               (int)((ulong)in_stack_fffffffffffff9b8 >> 0x20),in_stack_fffffffffffff9b0);
  Mat::create(in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
              (int)in_stack_fffffffffffff8e8,iVar1,in_stack_fffffffffffff8d8,
              in_stack_fffffffffffff8d0);
  for (local_4c8 = 0; local_4c8 + 3 < local_460; local_4c8 = local_4c8 + 4) {
    local_258 = &local_510;
    local_260 = &local_4b8;
    local_150 = (void *)((long)local_4b8 + local_478 * local_4c8 * local_4a8);
    local_138 = &local_510;
    local_8 = (long)local_48c * (long)local_488 * local_4a8;
    local_294 = local_4c8 + 1;
    local_288 = &local_558;
    local_290 = &local_4b8;
    local_118 = (void *)((long)local_4b8 + local_478 * local_294 * local_4a8);
    local_100 = &local_558;
    local_18 = (long)local_48c * (long)local_488 * local_4a8;
    local_2c4 = local_4c8 + 2;
    local_2b8 = &local_5a0;
    local_2c0 = &local_4b8;
    local_e0 = (void *)((long)local_4b8 + local_478 * local_2c4 * local_4a8);
    local_c8 = &local_5a0;
    local_28 = (long)local_48c * (long)local_488 * local_4a8;
    local_2f4 = local_4c8 + 3;
    local_2e8 = &local_5e8;
    local_2f0 = &local_4b8;
    local_a8 = (void *)((long)local_4b8 + local_478 * local_2f4 * local_4a8);
    local_90 = &local_5e8;
    local_38 = (long)local_48c * (long)local_488 * local_4a8;
    local_324 = local_4c8 / 4;
    local_318 = &stack0xfffffffffffff9c8;
    local_5c = *(int *)((long)local_458 + 0x2c);
    local_60 = (int)local_458[6];
    local_64 = *(undefined4 *)((long)local_458 + 0x34);
    local_70 = (undefined4 *)(*local_458 + local_458[8] * (long)local_324 * local_458[2]);
    local_78 = local_458[2];
    local_7c = (undefined4)local_458[3];
    local_88 = local_458[4];
    local_58 = &stack0xfffffffffffff9c8;
    local_48 = (long)local_5c * (long)local_60 * local_78;
    local_238 = &stack0xfffffffffffff9c8;
    local_448 = &stack0xfffffffffffff9c8;
    iVar1 = 0;
    local_5f0 = local_70;
    while (iVar2 = iVar1, iVar2 < local_45c) {
      local_1f8 = &local_510;
      local_208 = &local_558;
      local_218 = &local_5a0;
      local_228 = &local_5e8;
      for (local_664 = 0; local_664 < local_46c; local_664 = local_664 + 1) {
        *local_5f0 = *(undefined4 *)
                      ((long)local_150 +
                      (long)local_664 * 4 + (long)local_48c * (long)iVar2 * local_4a8);
        local_5f0[1] = *(undefined4 *)
                        ((long)local_118 +
                        (long)local_664 * 4 + (long)local_48c * (long)iVar2 * local_4a8);
        local_5f0[2] = *(undefined4 *)
                        ((long)local_e0 +
                        (long)local_664 * 4 + (long)local_48c * (long)iVar2 * local_4a8);
        local_5f0[3] = *(undefined4 *)
                        ((long)local_a8 +
                        (long)local_664 * 4 + (long)local_48c * (long)iVar2 * local_4a8);
        local_5f0 = local_5f0 + 4;
      }
      local_22c = iVar2;
      local_21c = iVar2;
      local_20c = iVar2;
      local_1fc = iVar2;
      iVar1 = iVar2 + 1;
    }
    local_438 = &local_5e8;
    local_428 = &local_5a0;
    local_418 = &local_558;
    local_56c = 0;
    local_598 = 0;
    local_5a0 = 0;
    local_5b4 = 0;
    local_5e0 = 0;
    local_5e8 = 0;
    local_c = 0x10;
    local_1c = 0x10;
    local_2c = 0x10;
    local_3c = 0x10;
    local_4c = 0x10;
    local_264 = local_4c8;
    local_265 = 1;
    local_295 = 1;
    local_2c5 = 1;
    local_2f5 = 1;
    local_325 = 1;
    local_560 = 0;
    local_578 = 0;
    local_5a8 = 0;
    local_5c0 = 0;
    local_558 = 0;
    local_530 = 0;
    local_524 = 0;
    local_518 = 0;
    local_550 = 0;
    local_408 = &local_510;
    local_510 = 0;
    local_500 = 0;
    local_4f8 = 0;
    local_4e8 = 0;
    local_4e4 = 0;
    local_4e0 = 0;
    local_4dc = 0;
    local_4d8 = 0;
    local_4d0 = 0;
    local_508 = 0;
    local_3b0 = local_408;
    local_390 = local_418;
    local_370 = local_428;
    local_350 = local_438;
    local_330 = local_448;
  }
  local_3f8 = &local_4b8;
  if (local_4b0 != (int *)0x0) {
    local_3d4 = 0xffffffff;
    LOCK();
    local_3d8 = *local_4b0;
    *local_4b0 = *local_4b0 + -1;
    UNLOCK();
    if (local_3d8 == 1) {
      local_3d0 = local_3f8;
      if (local_498 == (long *)0x0) {
        if (local_4b8 != (void *)0x0) {
          free(local_4b8);
        }
      }
      else {
        (**(code **)(*local_498 + 0x18))(local_498,local_4b8);
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack1to4_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 4b-4a-maxk-inch/4a-outch/4b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    kernel_tm.create(4 * maxk, inch, outch / 4);

    int q = 0;
    for (; q + 3 < outch; q += 4)
    {
        const Mat k0 = kernel.channel(q);
        const Mat k1 = kernel.channel(q + 1);
        const Mat k2 = kernel.channel(q + 2);
        const Mat k3 = kernel.channel(q + 3);

        float* g00 = kernel_tm.channel(q / 4);

        for (int p = 0; p < inch; p++)
        {
            const float* k00 = k0.row(p);
            const float* k10 = k1.row(p);
            const float* k20 = k2.row(p);
            const float* k30 = k3.row(p);

            for (int k = 0; k < maxk; k++)
            {
                g00[0] = k00[k];
                g00[1] = k10[k];
                g00[2] = k20[k];
                g00[3] = k30[k];

                g00 += 4;
            }
        }
    }
}